

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderStructTests.cpp
# Opt level: O2

int __thiscall
vkt::sr::anon_unknown_0::ShaderStructTests::init(ShaderStructTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"local",
             "Local structs");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c00108;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uniform",
             "Uniform structs");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c001b8;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ShaderStructTests::init (void)
{
	addChild(new LocalStructTests(m_testCtx));
	addChild(new UniformStructTests(m_testCtx));
}